

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::Selectable(char *label,bool selected,ImGuiSelectableFlags flags,ImVec2 *size_arg)

{
  ImVec2 p_min;
  bool bVar1;
  byte bVar2;
  ImGuiWindow *pIVar3;
  float *in_RCX;
  uint in_EDX;
  byte in_SIL;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  bool was_selected;
  ImGuiButtonFlags button_flags;
  ImGuiItemFlags backup_item_flags;
  bool item_add;
  float spacing_U;
  float spacing_L;
  float spacing_y;
  float spacing_x;
  ImRect bb_enlarged;
  ImVec2 text_max;
  ImVec2 text_min;
  float max_x;
  float min_x;
  ImVec2 pos;
  ImVec2 size;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  float in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  float in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  float fVar7;
  float fVar8;
  undefined4 in_stack_ffffffffffffff34;
  float _y;
  float in_stack_ffffffffffffff38;
  float _x;
  undefined4 in_stack_ffffffffffffff3c;
  float text_baseline_y;
  ImVec2 *size_00;
  ImGuiID id_00;
  ImRect *in_stack_ffffffffffffff48;
  ImVec2 *in_stack_ffffffffffffff50;
  ImU32 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5c;
  byte in_stack_ffffffffffffff5d;
  byte in_stack_ffffffffffffff5e;
  byte bVar9;
  uint uVar10;
  ImGuiItemFlags in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 uVar11;
  float fVar12;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  float in_stack_ffffffffffffff90;
  float local_64;
  float local_54;
  float fStack_50;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImGuiID local_3c;
  ImGuiStyle *pIVar13;
  ImGuiContext *bb;
  byte local_11;
  bool local_1;
  
  local_11 = in_SIL & 1;
  pIVar3 = GetCurrentWindow();
  if ((pIVar3->SkipItems & 1U) == 0) {
    pIVar13 = &GImGui->Style;
    bb = GImGui;
    if (((in_EDX & 2) != 0) && ((pIVar3->DC).CurrentColumns != (ImGuiColumns *)0x0)) {
      PushColumnsBackground();
    }
    size_00 = (ImVec2 *)0x0;
    local_3c = ImGuiWindow::GetID((ImGuiWindow *)0x0,
                                  (char *)CONCAT44(in_stack_ffffffffffffff3c,
                                                   in_stack_ffffffffffffff38),
                                  (char *)CONCAT44(in_stack_ffffffffffffff34,
                                                   in_stack_ffffffffffffff30));
    local_44 = CalcTextSize((char *)in_stack_ffffffffffffff48,(char *)size_00,
                            SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0),
                            in_stack_ffffffffffffff38);
    if ((*in_RCX != 0.0) || (NAN(*in_RCX))) {
      _x = *in_RCX;
    }
    else {
      _x = local_44.x;
    }
    if ((in_RCX[1] != 0.0) || (NAN(in_RCX[1]))) {
      _y = in_RCX[1];
    }
    else {
      _y = local_44.y;
    }
    text_baseline_y = _x;
    ImVec2::ImVec2(&local_4c,_x,_y);
    IVar6 = (pIVar3->DC).CursorPos;
    fVar12 = (pIVar3->DC).CurrLineTextBaseOffset;
    fStack_50 = IVar6.y;
    local_54 = IVar6.x;
    ItemSize(size_00,text_baseline_y);
    id_00 = (ImGuiID)((ulong)size_00 >> 0x20);
    fVar7 = local_54;
    if ((in_EDX & 2) != 0) {
      fVar7 = (pIVar3->ContentRegionRect).Min.x;
    }
    fVar8 = fVar7;
    if ((in_EDX & 2) == 0) {
      IVar6 = GetContentRegionMaxAbs();
      local_64 = IVar6.x;
    }
    else {
      local_64 = (pIVar3->ContentRegionRect).Max.x;
    }
    if (((*in_RCX == 0.0) && (!NAN(*in_RCX))) || ((in_EDX & 0x800000) != 0)) {
      local_4c.x = ImMax<float>(local_44.x,local_64 - fVar7);
    }
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff8c,fVar7 + local_4c.x,
                   fVar12 + fStack_50 + local_4c.y);
    ImRect::ImRect((ImRect *)CONCAT44(_y,fVar8),local_64,in_stack_ffffffffffffff28,
                   in_stack_ffffffffffffff24,in_stack_ffffffffffffff20);
    fVar12 = (pIVar13->ItemSpacing).x;
    fVar7 = (pIVar13->ItemSpacing).y;
    fVar4 = (float)(int)(fVar12 * 0.5);
    fVar5 = (float)(int)(fVar7 * 0.5);
    in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c - fVar4;
    in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80 - fVar5;
    in_stack_ffffffffffffff84 = (fVar12 - fVar4) + in_stack_ffffffffffffff84;
    in_stack_ffffffffffffff88 = (fVar7 - fVar5) + in_stack_ffffffffffffff88;
    if ((in_EDX & 8) == 0) {
      bVar1 = ItemAdd(in_stack_ffffffffffffff48,id_00,(ImRect *)CONCAT44(text_baseline_y,_x));
      uVar11 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff68);
    }
    else {
      in_stack_ffffffffffffff64 = (pIVar3->DC).ItemFlags;
      (pIVar3->DC).ItemFlags = (pIVar3->DC).ItemFlags | 0x14;
      bVar1 = ItemAdd(in_stack_ffffffffffffff48,id_00,(ImRect *)CONCAT44(text_baseline_y,_x));
      uVar11 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff68);
      (pIVar3->DC).ItemFlags = in_stack_ffffffffffffff64;
    }
    if ((char)((uint)uVar11 >> 0x18) == '\0') {
      if (((in_EDX & 2) != 0) && ((pIVar3->DC).CurrentColumns != (ImGuiColumns *)0x0)) {
        PopColumnsBackground();
      }
      local_1 = false;
    }
    else {
      uVar10 = 0;
      if ((in_EDX & 0x100000) != 0) {
        uVar10 = 0x2000;
      }
      if ((in_EDX & 0x200000) != 0) {
        uVar10 = uVar10 | 2;
      }
      if ((in_EDX & 0x400000) != 0) {
        uVar10 = uVar10 | 0x10;
      }
      if ((in_EDX & 8) != 0) {
        uVar10 = uVar10 | 0x400;
      }
      if ((in_EDX & 4) != 0) {
        uVar10 = uVar10 | 0x24;
      }
      if ((in_EDX & 0x10) != 0) {
        uVar10 = uVar10 | 0x100;
      }
      if ((in_EDX & 8) != 0) {
        local_11 = 0;
      }
      bVar9 = local_11;
      bVar2 = ButtonBehavior((ImRect *)CONCAT44(in_stack_ffffffffffffff7c,fVar12),(ImGuiID)fVar7,
                             (bool *)CONCAT44(fVar5,uVar11),
                             (bool *)CONCAT44(in_stack_ffffffffffffff64,uVar10),
                             CONCAT13(local_11,CONCAT12(in_stack_ffffffffffffff5e,
                                                        CONCAT11(in_stack_ffffffffffffff5d,
                                                                 in_stack_ffffffffffffff5c))));
      if (((((bool)bVar2) || (((in_stack_ffffffffffffff5e & 1) != 0 && ((in_EDX & 0x2000000) != 0)))
           ) && ((bb->NavDisableMouseHover & 1U) == 0)) &&
         ((bb->NavWindow == pIVar3 && (bb->NavLayer == (pIVar3->DC).NavLayerCurrent)))) {
        bb->NavDisableHighlight = true;
        SetNavID((ImGuiID)_y,(int)fVar8,(ImGuiID)local_64);
      }
      if ((bVar2 & 1) != 0) {
        MarkItemEdited((ImGuiID)in_stack_ffffffffffffff24);
      }
      if ((in_EDX & 0x10) != 0) {
        SetItemAllowOverlap();
      }
      if (local_11 != (bVar9 & 1)) {
        (pIVar3->DC).LastItemStatusFlags = (pIVar3->DC).LastItemStatusFlags | 8;
      }
      if (((in_stack_ffffffffffffff5d & 1) != 0) && ((in_EDX & 0x1000000) != 0)) {
        in_stack_ffffffffffffff5e = 1;
      }
      if (((in_stack_ffffffffffffff5e & 1) != 0) || (local_11 != 0)) {
        in_stack_ffffffffffffff58 = GetColorU32((ImGuiCol)_y,fVar8);
        in_stack_ffffffffffffff50 =
             (ImVec2 *)CONCAT44(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        in_stack_ffffffffffffff48 =
             (ImRect *)CONCAT44(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
        p_min.y = local_54;
        p_min.x = in_stack_ffffffffffffff90;
        IVar6.y = in_stack_ffffffffffffff8c;
        IVar6.x = in_stack_ffffffffffffff88;
        RenderFrame(p_min,IVar6,(ImU32)in_stack_ffffffffffffff84,
                    SUB41((uint)in_stack_ffffffffffffff80 >> 0x18,0),in_stack_ffffffffffffff7c);
        RenderNavHighlight((ImRect *)bb,(ImGuiID)((ulong)pIVar13 >> 0x20),
                           (ImGuiNavHighlightFlags)pIVar13);
      }
      if (((in_EDX & 2) != 0) && ((pIVar3->DC).CurrentColumns != (ImGuiColumns *)0x0)) {
        PopColumnsBackground();
      }
      if ((in_EDX & 8) != 0) {
        PushStyleColor(id_00,(ImVec4 *)CONCAT44(text_baseline_y,_x));
      }
      RenderTextClipped((ImVec2 *)CONCAT44(fVar7,fVar4),(ImVec2 *)CONCAT44(fVar5,uVar11),
                        (char *)CONCAT44(in_stack_ffffffffffffff64,uVar10),
                        (char *)CONCAT17(bVar9,CONCAT16(in_stack_ffffffffffffff5e,
                                                        CONCAT15(in_stack_ffffffffffffff5d,
                                                                 CONCAT14(bVar2,
                                                  in_stack_ffffffffffffff58)))),
                        in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->Min,
                        (ImRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      if ((in_EDX & 8) != 0) {
        PopStyleColor((int)in_stack_ffffffffffffff24);
      }
      if (((((bVar2 & 1) != 0) && ((pIVar3->Flags & 0x4000000U) != 0)) && ((in_EDX & 1) == 0)) &&
         (((pIVar3->DC).ItemFlags & 0x20U) == 0)) {
        CloseCurrentPopup();
      }
      local_1 = (bool)(bVar2 & 1);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::Selectable(const char* label, bool selected, ImGuiSelectableFlags flags, const ImVec2& size_arg)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    if ((flags & ImGuiSelectableFlags_SpanAllColumns) && window->DC.CurrentColumns) // FIXME-OPT: Avoid if vertically clipped.
        PushColumnsBackground();

    // Submit label or explicit size to ItemSize(), whereas ItemAdd() will submit a larger/spanning rectangle.
    ImGuiID id = window->GetID(label);
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    ImVec2 size(size_arg.x != 0.0f ? size_arg.x : label_size.x, size_arg.y != 0.0f ? size_arg.y : label_size.y);
    ImVec2 pos = window->DC.CursorPos;
    pos.y += window->DC.CurrLineTextBaseOffset;
    ItemSize(size, 0.0f);

    // Fill horizontal space
    const float min_x = (flags & ImGuiSelectableFlags_SpanAllColumns) ? window->ContentRegionRect.Min.x : pos.x;
    const float max_x = (flags & ImGuiSelectableFlags_SpanAllColumns) ? window->ContentRegionRect.Max.x : GetContentRegionMaxAbs().x;
    if (size_arg.x == 0.0f || (flags & ImGuiSelectableFlags_SpanAvailWidth))
        size.x = ImMax(label_size.x, max_x - min_x);

    // Text stays at the submission position, but bounding box may be extended on both sides
    const ImVec2 text_min = pos;
    const ImVec2 text_max(min_x + size.x, pos.y + size.y);

    // Selectables are meant to be tightly packed together with no click-gap, so we extend their box to cover spacing between selectable.
    ImRect bb_enlarged(min_x, pos.y, text_max.x, text_max.y);
    const float spacing_x = style.ItemSpacing.x;
    const float spacing_y = style.ItemSpacing.y;
    const float spacing_L = IM_FLOOR(spacing_x * 0.50f);
    const float spacing_U = IM_FLOOR(spacing_y * 0.50f);
    bb_enlarged.Min.x -= spacing_L;
    bb_enlarged.Min.y -= spacing_U;
    bb_enlarged.Max.x += (spacing_x - spacing_L);
    bb_enlarged.Max.y += (spacing_y - spacing_U);
    //if (g.IO.KeyCtrl) { GetForegroundDrawList()->AddRect(bb_align.Min, bb_align.Max, IM_COL32(255, 0, 0, 255)); }
    //if (g.IO.KeyCtrl) { GetForegroundDrawList()->AddRect(bb_enlarged.Min, bb_enlarged.Max, IM_COL32(0, 255, 0, 255)); }

    bool item_add;
    if (flags & ImGuiSelectableFlags_Disabled)
    {
        ImGuiItemFlags backup_item_flags = window->DC.ItemFlags;
        window->DC.ItemFlags |= ImGuiItemFlags_Disabled | ImGuiItemFlags_NoNavDefaultFocus;
        item_add = ItemAdd(bb_enlarged, id);
        window->DC.ItemFlags = backup_item_flags;
    }
    else
    {
        item_add = ItemAdd(bb_enlarged, id);
    }
    if (!item_add)
    {
        if ((flags & ImGuiSelectableFlags_SpanAllColumns) && window->DC.CurrentColumns)
            PopColumnsBackground();
        return false;
    }

    // We use NoHoldingActiveID on menus so user can click and _hold_ on a menu then drag to browse child entries
    ImGuiButtonFlags button_flags = 0;
    if (flags & ImGuiSelectableFlags_NoHoldingActiveID) { button_flags |= ImGuiButtonFlags_NoHoldingActiveId; }
    if (flags & ImGuiSelectableFlags_SelectOnClick)     { button_flags |= ImGuiButtonFlags_PressedOnClick; }
    if (flags & ImGuiSelectableFlags_SelectOnRelease)   { button_flags |= ImGuiButtonFlags_PressedOnRelease; }
    if (flags & ImGuiSelectableFlags_Disabled)          { button_flags |= ImGuiButtonFlags_Disabled; }
    if (flags & ImGuiSelectableFlags_AllowDoubleClick)  { button_flags |= ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnDoubleClick; }
    if (flags & ImGuiSelectableFlags_AllowItemOverlap)  { button_flags |= ImGuiButtonFlags_AllowItemOverlap; }

    if (flags & ImGuiSelectableFlags_Disabled)
        selected = false;

    const bool was_selected = selected;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb_enlarged, id, &hovered, &held, button_flags);

    // Update NavId when clicking or when Hovering (this doesn't happen on most widgets), so navigation can be resumed with gamepad/keyboard
    if (pressed || (hovered && (flags & ImGuiSelectableFlags_SetNavIdOnHover)))
    {
        if (!g.NavDisableMouseHover && g.NavWindow == window && g.NavLayer == window->DC.NavLayerCurrent)
        {
            g.NavDisableHighlight = true;
            SetNavID(id, window->DC.NavLayerCurrent, window->DC.NavFocusScopeIdCurrent);
        }
    }
    if (pressed)
        MarkItemEdited(id);

    if (flags & ImGuiSelectableFlags_AllowItemOverlap)
        SetItemAllowOverlap();

    // In this branch, Selectable() cannot toggle the selection so this will never trigger.
    if (selected != was_selected) //-V547
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_ToggledSelection;

    // Render
    if (held && (flags & ImGuiSelectableFlags_DrawHoveredWhenHeld))
        hovered = true;
    if (hovered || selected)
    {
        const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        RenderFrame(bb_enlarged.Min, bb_enlarged.Max, col, false, 0.0f);
        RenderNavHighlight(bb_enlarged, id, ImGuiNavHighlightFlags_TypeThin | ImGuiNavHighlightFlags_NoRounding);
    }

    if ((flags & ImGuiSelectableFlags_SpanAllColumns) && window->DC.CurrentColumns)
        PopColumnsBackground();

    if (flags & ImGuiSelectableFlags_Disabled) PushStyleColor(ImGuiCol_Text, style.Colors[ImGuiCol_TextDisabled]);
    RenderTextClipped(text_min, text_max, label, NULL, &label_size, style.SelectableTextAlign, &bb_enlarged);
    if (flags & ImGuiSelectableFlags_Disabled) PopStyleColor();

    // Automatically close popups
    if (pressed && (window->Flags & ImGuiWindowFlags_Popup) && !(flags & ImGuiSelectableFlags_DontClosePopups) && !(window->DC.ItemFlags & ImGuiItemFlags_SelectableDontClosePopup))
        CloseCurrentPopup();

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags);
    return pressed;
}